

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O3

unsigned_short
beast::lexicalCast<unsigned_short,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          unsigned_short defaultValue)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_short out;
  unsigned_short local_42;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  long local_38;
  long local_30 [2];
  
  pcVar1 = (in->_M_dataplus)._M_p;
  local_40._M_current = (char *)local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + in->_M_string_length);
  bVar2 = detail::
          parseUnsigned<unsigned_short,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_42,local_40,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_40._M_current + local_38));
  if ((long *)local_40._M_current != local_30) {
    operator_delete(local_40._M_current,local_30[0] + 1);
  }
  if (bVar2) {
    defaultValue = local_42;
  }
  return defaultValue;
}

Assistant:

Out lexicalCast (In in, Out defaultValue = Out ())
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    return defaultValue;
}